

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void deflate_finish_block
               (libdeflate_compressor *c,deflate_output_bitstream *os,u8 *block_begin,
               u32 block_length,deflate_sequence *sequences,_Bool is_final_block)

{
  u32 *puVar1;
  
  puVar1 = (c->freqs).litlen + 0x100;
  *puVar1 = *puVar1 + 1;
  deflate_make_huffman_codes(&c->freqs,&c->codes);
  deflate_flush_block(c,os,block_begin,block_length,sequences,is_final_block);
  return;
}

Assistant:

static void
deflate_finish_block(struct libdeflate_compressor *c,
		     struct deflate_output_bitstream *os,
		     const u8 *block_begin, u32 block_length,
		     const struct deflate_sequence *sequences,
		     bool is_final_block)
{
	c->freqs.litlen[DEFLATE_END_OF_BLOCK]++;
	deflate_make_huffman_codes(&c->freqs, &c->codes);
	deflate_flush_block(c, os, block_begin, block_length, sequences,
			    is_final_block);
}